

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

int __thiscall
cmCTest::GenerateCTestNotesOutput(cmCTest *this,cmXMLWriter *xml,VectorOfStrings *files)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  undefined8 *puVar5;
  long *plVar6;
  ostream *poVar7;
  size_type *psVar8;
  ulong *puVar9;
  undefined8 uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string note_time;
  string buildname;
  ostringstream cmCTestLog_msg_1;
  ifstream ifs;
  string local_420;
  cmCTest *local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  VectorOfStrings *local_3d8;
  string local_3d0;
  string local_3b0 [3];
  ios_base local_340 [264];
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  paVar1 = &local_3b0[0].field_2;
  local_3d8 = files;
  local_3b0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"BuildName","");
  GetCTestConfiguration(&local_238,this,local_3b0);
  SafeBuildIdField(&local_3d0,&local_238);
  paVar2 = &local_238.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b0[0]._M_dataplus._M_p,local_3b0[0].field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::StartDocument(xml,"UTF-8");
  cmXMLWriter::ProcessingInstruction
            (xml,"xml-stylesheet",
             "type=\"text/xsl\" href=\"Dart/Source/Server/XSL/Build.xsl <file:///Dart/Source/Server/XSL/Build.xsl> \""
            );
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Site","");
  cmXMLWriter::StartElement(xml,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"BuildName",&local_3d0);
  pcVar3 = (this->CurrentTag)._M_dataplus._M_p;
  local_3b0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b0,pcVar3,pcVar3 + (this->CurrentTag)._M_string_length);
  std::__cxx11::string::append((char *)local_3b0);
  GetTestModelString_abi_cxx11_(&local_420,this);
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0[0]._M_dataplus._M_p != paVar1) {
    uVar10 = local_3b0[0].field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < local_420._M_string_length + local_3b0[0]._M_string_length) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      uVar10 = local_420.field_2._M_allocated_capacity;
    }
    if (local_420._M_string_length + local_3b0[0]._M_string_length <= (ulong)uVar10) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_420,0,(char *)0x0,(ulong)local_3b0[0]._M_dataplus._M_p);
      goto LAB_0028e91a;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)local_3b0,(ulong)local_420._M_dataplus._M_p);
LAB_0028e91a:
  psVar8 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_238.field_2._M_allocated_capacity = *psVar8;
    local_238.field_2._8_8_ = puVar5[3];
    local_238._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_238.field_2._M_allocated_capacity = *psVar8;
    local_238._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_238._M_string_length = puVar5[1];
  *puVar5 = psVar8;
  puVar5[1] = 0;
  *(undefined1 *)psVar8 = 0;
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"BuildStamp",&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b0[0]._M_dataplus._M_p,local_3b0[0].field_2._M_allocated_capacity + 1);
  }
  local_3b0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"Site","");
  GetCTestConfiguration(&local_238,this,local_3b0);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"Name",&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b0[0]._M_dataplus._M_p,local_3b0[0].field_2._M_allocated_capacity + 1);
  }
  local_3b0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"ctest","");
  cmVersion::GetCMakeVersion();
  plVar6 = (long *)std::__cxx11::string::append((char *)local_3b0);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_238.field_2._M_allocated_capacity = *psVar8;
    local_238.field_2._8_8_ = plVar6[3];
    local_238._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_238.field_2._M_allocated_capacity = *psVar8;
    local_238._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_238._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"Generator",&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b0[0]._M_dataplus._M_p,local_3b0[0].field_2._M_allocated_capacity + 1);
  }
  AddSiteProperties(this,xml);
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Notes","");
  cmXMLWriter::StartElement(xml,&local_238);
  local_400 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  __rhs = &((local_3d8->super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>)._M_impl.
            super__Vector_impl_data._M_start)->super_string;
  if (__rhs != &((local_3d8->super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>).
                 _M_impl.super__Vector_impl_data._M_finish)->super_string) {
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,"\tAdd file: ",0xb);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_238,(__rhs->_M_dataplus)._M_p,__rhs->_M_string_length);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(local_400,1,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x592,local_3b0[0]._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
        operator_delete(local_3b0[0]._M_dataplus._M_p,local_3b0[0].field_2._M_allocated_capacity + 1
                       );
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      CurrentTime_abi_cxx11_(&local_420,local_400);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Note","");
      cmXMLWriter::StartElement(xml,&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      cmXMLWriter::Attribute<cmsys::String>(xml,"Name",(String *)__rhs);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Time","");
      local_3b0[0]._M_dataplus._M_p = (pointer)cmsys::SystemTools::GetTime();
      cmXMLWriter::Element<double>(xml,&local_238,(double *)local_3b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"DateTime","");
      cmXMLWriter::StartElement(xml,&local_238);
      cmXMLWriter::Content<std::__cxx11::string>(xml,&local_420);
      cmXMLWriter::EndElement(xml);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Text","");
      cmXMLWriter::StartElement(xml,&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      std::ifstream::ifstream(&local_238,(__rhs->_M_dataplus)._M_p,_S_in);
      if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0) {
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        local_3b0[0]._M_string_length = 0;
        local_3b0[0].field_2._M_allocated_capacity =
             local_3b0[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        while( true ) {
          bVar4 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)&local_238,local_3b0,(bool *)0x0,-1);
          if (!bVar4) break;
          cmXMLWriter::Content<std::__cxx11::string>(xml,local_3b0);
          cmXMLWriter::Content<char[2]>(xml,(char (*) [2])0x6923c4);
        }
        std::ifstream::close();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
          operator_delete(local_3b0[0]._M_dataplus._M_p,
                          local_3b0[0].field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::operator+(&local_3f8,"Problem reading file: ",__rhs);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_3f8);
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        puVar9 = (ulong *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_3b0[0].field_2._0_8_ = *puVar9;
          local_3b0[0].field_2._8_8_ = plVar6[3];
        }
        else {
          local_3b0[0].field_2._0_8_ = *puVar9;
          local_3b0[0]._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_3b0[0]._M_string_length = plVar6[1];
        *plVar6 = (long)puVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        cmXMLWriter::Content<std::__cxx11::string>(xml,local_3b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
          operator_delete(local_3b0[0]._M_dataplus._M_p,
                          local_3b0[0].field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3b0,"Problem reading file: ",0x16);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_3b0,(__rhs->_M_dataplus)._M_p,__rhs->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," while creating notes",0x15);
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(local_400,6,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x5a4,local_3f8._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
        std::ios_base::~ios_base(local_340);
      }
      cmXMLWriter::EndElement(xml);
      cmXMLWriter::EndElement(xml);
      std::ifstream::~ifstream(&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420._M_dataplus._M_p != &local_420.field_2) {
        operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
      }
      __rhs = __rhs + 1;
    } while (__rhs != &((local_3d8->
                        super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>)._M_impl.
                        super__Vector_impl_data._M_finish)->super_string);
  }
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndDocument(xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  return 1;
}

Assistant:

int cmCTest::GenerateCTestNotesOutput(cmXMLWriter& xml,
                                      const cmCTest::VectorOfStrings& files)
{
  std::string buildname =
    cmCTest::SafeBuildIdField(this->GetCTestConfiguration("BuildName"));
  cmCTest::VectorOfStrings::const_iterator it;
  xml.StartDocument();
  xml.ProcessingInstruction("xml-stylesheet",
                            "type=\"text/xsl\" "
                            "href=\"Dart/Source/Server/XSL/Build.xsl "
                            "<file:///Dart/Source/Server/XSL/Build.xsl> \"");
  xml.StartElement("Site");
  xml.Attribute("BuildName", buildname);
  xml.Attribute("BuildStamp",
                this->CurrentTag + "-" + this->GetTestModelString());
  xml.Attribute("Name", this->GetCTestConfiguration("Site"));
  xml.Attribute("Generator",
                std::string("ctest") + cmVersion::GetCMakeVersion());
  this->AddSiteProperties(xml);
  xml.StartElement("Notes");

  for (it = files.begin(); it != files.end(); it++) {
    cmCTestLog(this, OUTPUT, "\tAdd file: " << *it << std::endl);
    std::string note_time = this->CurrentTime();
    xml.StartElement("Note");
    xml.Attribute("Name", *it);
    xml.Element("Time", cmSystemTools::GetTime());
    xml.Element("DateTime", note_time);
    xml.StartElement("Text");
    cmsys::ifstream ifs(it->c_str());
    if (ifs) {
      std::string line;
      while (cmSystemTools::GetLineFromStream(ifs, line)) {
        xml.Content(line);
        xml.Content("\n");
      }
      ifs.close();
    } else {
      xml.Content("Problem reading file: " + *it + "\n");
      cmCTestLog(this, ERROR_MESSAGE, "Problem reading file: "
                   << *it << " while creating notes" << std::endl);
    }
    xml.EndElement(); // Text
    xml.EndElement(); // Note
  }
  xml.EndElement(); // Notes
  xml.EndElement(); // Site
  xml.EndDocument();
  return 1;
}